

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueNameGenerator.cpp
# Opt level: O3

void __thiscall
Assimp::MDL::HalfLife::UniqueNameGenerator::make_unique
          (UniqueNameGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  size_t __n;
  pointer pcVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  pointer pbVar8;
  long lVar9;
  _Link_type p_Var10;
  _List_node_base *p_Var11;
  byte extraout_var;
  uchar *puVar12;
  _Base_ptr p_Var13;
  _Rb_tree_header *p_Var14;
  _Base_ptr p_Var15;
  _Rb_tree_node_base *p_Var16;
  iterator iVar17;
  _Rb_tree_node_base *p_Var18;
  size_t id;
  iterator it;
  unsigned_long *puVar19;
  bool bVar20;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar21;
  vector<unsigned_long,_std::allocator<unsigned_long>_> empty_names_indices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> template_name_duplicates;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
  names_to_duplicates;
  anon_class_8_1_8991fb9c format_name;
  string template_name_with_separator;
  anon_class_24_3_9cb0d701 generate_unique_name;
  _List_node_base *local_160;
  undefined1 local_158 [32];
  _Rb_tree_node_base local_138;
  UniqueNameGenerator *local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  unsigned_long *local_108;
  iterator iStack_100;
  unsigned_long *local_f8;
  unsigned_long *local_e8;
  iterator iStack_e0;
  unsigned_long *local_d8;
  _Rb_tree_node_base *local_c8;
  _Rb_tree_node_base *local_c0;
  _Base_ptr local_b8;
  _Base_ptr p_Stack_b0;
  _Rb_tree_node_base *local_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
  local_a0;
  UniqueNameGenerator *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
  *local_48;
  UniqueNameGenerator **local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_108 = (unsigned_long *)0x0;
  iStack_100._M_current = (unsigned_long *)0x0;
  local_f8 = (unsigned_long *)0x0;
  local_d8 = (unsigned_long *)0x0;
  local_e8 = (unsigned_long *)0x0;
  iStack_e0._M_current = (unsigned_long *)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar17._M_current = (unsigned_long *)this;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::operator+(&local_68,&this->template_name_,&this->separator_);
  local_40 = &local_70;
  local_48 = &local_a0;
  local_160 = (_List_node_base *)0x0;
  pbVar8 = (names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_118 = this;
  local_110 = names;
  local_70 = this;
  local_38 = names;
  if ((names->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar8) {
    do {
      lVar9 = std::__cxx11::string::find_first_not_of
                        ((char)((long)local_160 << 5) + (char)pbVar8,0x20);
      if (lVar9 == -1) {
        iVar17._M_current = iStack_100._M_current;
        if (iStack_100._M_current == local_f8) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_108,iStack_100,
                     (unsigned_long *)&local_160);
        }
        else {
          *iStack_100._M_current = (unsigned_long)local_160;
          iStack_100._M_current = iStack_100._M_current + 1;
        }
      }
      else {
        pbVar2 = (names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar8 = pbVar2 + (long)local_160;
        __n = pbVar2[(long)local_160]._M_string_length;
        if ((__n == (this->template_name_)._M_string_length) &&
           ((__n == 0 ||
            (iVar6 = bcmp((pbVar8->_M_dataplus)._M_p,(this->template_name_)._M_dataplus._M_p,__n),
            iVar6 == 0)))) {
LAB_004871c3:
          if (iStack_e0._M_current == local_d8) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_e8,iStack_e0,
                       (unsigned_long *)&local_160);
          }
          else {
            *iStack_e0._M_current = (unsigned_long)local_160;
            iStack_e0._M_current = iStack_e0._M_current + 1;
          }
        }
        else {
          std::__cxx11::string::substr((ulong)local_158,(ulong)pbVar8);
          uVar5 = local_158._0_8_;
          if (local_158._8_8_ == local_68._M_string_length) {
            if ((_Base_ptr)local_158._8_8_ == (_Base_ptr)0x0) {
              bVar20 = true;
            }
            else {
              iVar6 = bcmp((void *)local_158._0_8_,local_68._M_dataplus._M_p,local_158._8_8_);
              bVar20 = iVar6 == 0;
            }
          }
          else {
            bVar20 = false;
          }
          if ((undefined1 *)uVar5 != local_158 + 0x10) {
            operator_delete((void *)uVar5,(ulong)((long)(_Rb_tree_color *)local_158._16_8_ + 1));
          }
          if (bVar20) goto LAB_004871c3;
        }
        pbVar8 = (names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (local_a0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          pbVar8 = pbVar8 + (long)local_160;
          p_Var14 = &local_a0._M_impl.super__Rb_tree_header;
          p_Var13 = local_a0._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            uVar7 = std::__cxx11::string::compare((string *)(p_Var13 + 1));
            p_Var15 = p_Var13;
            if ((int)uVar7 < 0) {
              p_Var15 = &p_Var14->_M_header;
            }
            p_Var13 = (&p_Var13->_M_left)[uVar7 >> 0x1f];
            p_Var14 = (_Rb_tree_header *)p_Var15;
          } while (p_Var13 != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var15 == &local_a0._M_impl.super__Rb_tree_header) {
            pbVar8 = (names->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            iVar6 = std::__cxx11::string::compare((string *)pbVar8);
            pbVar8 = (names->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (-1 < iVar6) {
              p_Var10 = (_Link_type)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                                      *)&local_a0,pbVar8 + (long)local_160);
              this = local_118;
              p_Var11 = (_List_node_base *)operator_new(0x18);
              p_Var11[1]._M_next = local_160;
              iVar17._M_current = (unsigned_long *)p_Var10;
              std::__detail::_List_node_base::_M_hook(p_Var11);
              paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)&(p_Var10->super__Rb_tree_node_base)._M_left;
              paVar1->_M_allocated_capacity = paVar1->_M_allocated_capacity + 1;
              goto LAB_004874e6;
            }
          }
        }
        local_b8 = (_Base_ptr)0x0;
        p_Stack_b0 = (_Base_ptr)0x0;
        local_158._0_8_ = local_158 + 0x10;
        pcVar3 = pbVar8[(long)local_160]._M_dataplus._M_p;
        local_c8 = (_Rb_tree_node_base *)&local_c8;
        local_c0 = (_Rb_tree_node_base *)&local_c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_158,pcVar3,pcVar3 + pbVar8[(long)local_160]._M_string_length);
        local_138._0_8_ = local_c8;
        local_138._M_parent = local_c0;
        local_138._M_left = local_b8;
        p_Var18 = &local_138;
        p_Var13 = &local_138;
        if (local_c8 != (_Rb_tree_node_base *)&local_c8) {
          *(_Rb_tree_node_base **)local_c0 = &local_138;
          *(_Rb_tree_node_base **)(local_138._0_8_ + 8) = &local_138;
          local_b8 = (_Base_ptr)0x0;
          p_Var18 = (_Rb_tree_node_base *)local_138._0_8_;
          p_Var13 = local_138._M_parent;
          local_c8 = (_Rb_tree_node_base *)&local_c8;
          local_c0 = (_Rb_tree_node_base *)&local_c8;
        }
        local_138._M_parent = p_Var13;
        local_138._0_8_ = p_Var18;
        local_138._M_right = p_Stack_b0;
        iVar17._M_current = (unsigned_long *)local_158;
        pVar21 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
                 ::_M_get_insert_unique_pos(&local_a0,(key_type *)iVar17._M_current);
        p_Var16 = pVar21.second;
        p_Var18 = (_Rb_tree_node_base *)local_138._0_8_;
        this = local_118;
        if (p_Var16 != (_Rb_tree_node_base *)0x0) {
          bVar20 = true;
          if (&local_a0._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var16 &&
              pVar21.first == (_Rb_tree_node_base *)0x0) {
            std::__cxx11::string::compare((string *)local_158);
            bVar20 = (bool)(extraout_var >> 7);
          }
          iVar17._M_current = (unsigned_long *)operator_new(0x60);
          *(uchar **)(((_Link_type)iVar17._M_current)->_M_storage)._M_storage =
               (((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&((_Link_type)iVar17._M_current)->_M_storage,local_158._0_8_,
                     (undefined1 *)((long)(_Rb_tree_color *)local_158._8_8_ + local_158._0_8_));
          puVar12 = (((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x20;
          *(undefined8 *)((((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x20) =
               local_138._0_8_;
          *(_Base_ptr *)((((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x28) =
               local_138._M_parent;
          *(_Base_ptr *)((((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x30) =
               local_138._M_left;
          if ((_Rb_tree_node_base *)local_138._0_8_ == &local_138) {
            *(uchar **)((((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x28) = puVar12;
            *(uchar **)((((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x20) = puVar12;
          }
          else {
            *(uchar **)local_138._M_parent = puVar12;
            *(uchar **)(*(long *)puVar12 + 8) = puVar12;
            local_138._M_left = (_Base_ptr)0x0;
            local_138._0_8_ = &local_138;
            local_138._M_parent = &local_138;
          }
          *(_Base_ptr *)((((_Link_type)iVar17._M_current)->_M_storage)._M_storage + 0x38) =
               local_138._M_right;
          std::_Rb_tree_insert_and_rebalance
                    (bVar20,(_Rb_tree_node_base *)iVar17._M_current,p_Var16,
                     &local_a0._M_impl.super__Rb_tree_header._M_header);
          local_a0._M_impl.super__Rb_tree_header._M_node_count =
               local_a0._M_impl.super__Rb_tree_header._M_node_count + 1;
          p_Var18 = (_Rb_tree_node_base *)local_138._0_8_;
          this = local_118;
          names = local_110;
        }
        while (local_118 = this, p_Var18 != &local_138) {
          p_Var16 = *(_Rb_tree_node_base **)p_Var18;
          iVar17._M_current = (unsigned_long *)0x18;
          operator_delete(p_Var18,0x18);
          p_Var18 = p_Var16;
          this = local_118;
        }
        p_Var18 = local_c8;
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          iVar17._M_current = (unsigned_long *)((long)&((_Base_ptr)local_158._16_8_)->_M_color + 1);
          operator_delete((void *)local_158._0_8_,(ulong)iVar17._M_current);
          p_Var18 = local_c8;
        }
        while (p_Var18 != (_Rb_tree_node_base *)&local_c8) {
          p_Var16 = *(_Rb_tree_node_base **)p_Var18;
          iVar17._M_current = (unsigned_long *)0x18;
          operator_delete(p_Var18,0x18);
          p_Var18 = p_Var16;
        }
      }
LAB_004874e6:
      local_160 = (_List_node_base *)((long)&local_160->_M_next + 1);
      pbVar8 = (names->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (local_160 <
             (_List_node_base *)
             ((long)(names->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5));
  }
  if ((_Rb_tree_header *)local_a0._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_a0._M_impl.super__Rb_tree_header) {
    p_Var13 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      p_Var18 = *(_Rb_tree_node_base **)(p_Var13 + 2);
      local_a8 = p_Var13;
      if (p_Var18 != p_Var13 + 2) {
        do {
          make_unique(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0
          ::operator()::string_const___const((string *)local_158,&local_48,(string *)(p_Var13 + 1));
          iVar17._M_current = (unsigned_long *)local_158;
          std::__cxx11::string::operator=
                    ((string *)
                     ((local_110->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (long)p_Var18->_M_left),
                     (string *)local_158);
          if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
            iVar17._M_current = (unsigned_long *)((long)(_Rb_tree_color *)local_158._16_8_ + 1);
            operator_delete((void *)local_158._0_8_,(ulong)iVar17._M_current);
          }
          p_Var18 = *(_Rb_tree_node_base **)p_Var18;
        } while (p_Var18 != p_Var13 + 2);
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(local_a8);
    } while ((_Rb_tree_header *)p_Var13 != &local_a0._M_impl.super__Rb_tree_header);
  }
  puVar19 = local_108;
  if (iStack_e0._M_current == local_e8) {
    if (local_108 != iStack_100._M_current) {
      lVar9 = 0;
      id = 0;
      do {
        make_unique(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1::
        operator()::string_const__unsigned_long__const
                  ((string *)local_158,local_70,&local_118->template_name_,id);
        iVar17._M_current = (unsigned_long *)local_158;
        std::__cxx11::string::operator=
                  ((string *)
                   ((local_110->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + puVar19[id]),(string *)local_158);
        if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
          iVar17._M_current = (unsigned_long *)((long)(_Rb_tree_color *)local_158._16_8_ + 1);
          operator_delete((void *)local_158._0_8_,(ulong)iVar17._M_current);
        }
        id = id + 1;
        lVar4 = lVar9 + 8;
        lVar9 = lVar9 + 8;
      } while ((unsigned_long *)((long)puVar19 + lVar4) != iStack_100._M_current);
    }
  }
  else if (local_108 != iStack_100._M_current) {
    do {
      make_unique(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0::
      operator()::string_const___const((string *)local_158,&local_48,&local_118->template_name_);
      iVar17._M_current = (unsigned_long *)local_158;
      std::__cxx11::string::operator=
                ((string *)
                 ((local_110->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + *puVar19),(string *)local_158);
      if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
        iVar17._M_current = (unsigned_long *)((long)(_Rb_tree_color *)local_158._16_8_ + 1);
        operator_delete((void *)local_158._0_8_,(ulong)iVar17._M_current);
      }
      puVar19 = puVar19 + 1;
    } while (puVar19 != iStack_100._M_current);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    iVar17._M_current = (unsigned_long *)(local_68.field_2._M_allocated_capacity + 1);
    operator_delete(local_68._M_dataplus._M_p,(ulong)iVar17._M_current);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DuplicateInfo>_>_>
              *)local_a0._M_impl.super__Rb_tree_header._M_header._M_parent,
             (_Link_type)iVar17._M_current);
  if (local_e8 != (unsigned_long *)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  if (local_108 != (unsigned_long *)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  return;
}

Assistant:

void UniqueNameGenerator::make_unique(std::vector<std::string> &names) {
    struct DuplicateInfo {
        DuplicateInfo() :
            indices(),
            next_id(0) {
        }

        std::list<size_t> indices;
        size_t next_id;
    };

    std::vector<size_t> empty_names_indices;
    std::vector<size_t> template_name_duplicates;
    std::map<std::string, DuplicateInfo> names_to_duplicates;

    const std::string template_name_with_separator(template_name_ + separator_);

    auto format_name = [&](const std::string &base_name, size_t id) -> std::string {
        return base_name + separator_ + std::to_string(id);
    };

    auto generate_unique_name = [&](const std::string &base_name) -> std::string {
        auto *duplicate_info = &names_to_duplicates[base_name];

        std::string new_name = "";

        bool found_identical_name;
        bool tried_with_base_name_only = false;
        do {
            // Assume that no identical name exists.
            found_identical_name = false;

            if (!tried_with_base_name_only) {
                // First try with only the base name.
                new_name = base_name;
            } else {
                // Create the name expected to be unique.
                new_name = format_name(base_name, duplicate_info->next_id);
            }

            // Check in the list of duplicates for an identical name.
            for (size_t i = 0;
                    i < names.size() &&
                    !found_identical_name;
                    ++i) {
                if (new_name == names[i])
                    found_identical_name = true;
            }

            if (tried_with_base_name_only)
                ++duplicate_info->next_id;

            tried_with_base_name_only = true;

        } while (found_identical_name);

        return new_name;
    };

    for (size_t i = 0; i < names.size(); ++i) {
        // Check for empty names.
        if (names[i].find_first_not_of(' ') == std::string::npos) {
            empty_names_indices.push_back(i);
            continue;
        }

        /* Check for potential duplicate.
        a) Either if this name is the same as the template name or
        b) <template name><separator> is found at the beginning. */
        if (names[i] == template_name_ ||
                names[i].substr(0, template_name_with_separator.length()) == template_name_with_separator)
            template_name_duplicates.push_back(i);

        // Map each unique name to it's duplicate.
        if (names_to_duplicates.count(names[i]) == 0)
            names_to_duplicates.insert({ names[i], DuplicateInfo()});
        else
            names_to_duplicates[names[i]].indices.push_back(i);
    }

    // Make every non-empty name unique.
    for (auto it = names_to_duplicates.begin();
            it != names_to_duplicates.end(); ++it) {
        for (auto it2 = it->second.indices.begin();
                it2 != it->second.indices.end();
                ++it2)
            names[*it2] = generate_unique_name(it->first);
    }

    // Generate a unique name for every empty string.
    if (template_name_duplicates.size()) {
        // At least one string ressembles to <template name>.
        for (auto it = empty_names_indices.begin();
                it != empty_names_indices.end(); ++it)
            names[*it] = generate_unique_name(template_name_);
    } else {
        // No string alike <template name> exists.
        size_t i = 0;
        for (auto it = empty_names_indices.begin();
                it != empty_names_indices.end(); ++it, ++i)
            names[*it] = format_name(template_name_, i);
    }
}